

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasIOS13Features(Model *model)

{
  uint32 uVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  Pipeline *pPVar5;
  TextClassifier *pTVar6;
  PipelineRegressor *pPVar7;
  PipelineClassifier *pPVar8;
  long lVar9;
  void **ppvVar10;
  bool bVar11;
  
  bVar4 = true;
  if (model->isupdatable_ != false) {
    return true;
  }
  uVar1 = model->_oneof_case_[0];
  switch(uVar1) {
  case 2000:
    pTVar6 = Specification::Model::textclassifier(model);
    break;
  case 0x7d1:
  case 0x7d2:
switchD_00207399_caseD_7d1:
    bVar4 = hasIOS13NeuralNetworkFeatures(model);
    return bVar4;
  case 0x7d3:
    goto switchD_00207399_caseD_7d3;
  case 0x7d4:
    pTVar6 = (TextClassifier *)Specification::Model::gazetteer(model);
    break;
  case 0x7d5:
    pTVar6 = (TextClassifier *)Specification::Model::wordembedding(model);
    break;
  default:
    if (uVar1 == 200) {
      pPVar8 = Specification::Model::pipelineclassifier(model);
      pPVar5 = pPVar8->pipeline_;
      if (pPVar5 == (Pipeline *)0x0) {
        pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
      }
      pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
      ppvVar10 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar10 = (void **)0x0;
      }
      iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
      lVar9 = 0;
      do {
        bVar11 = (long)iVar2 * 8 == lVar9;
        bVar4 = !bVar11;
        if (bVar11) {
          return bVar4;
        }
        bVar11 = hasIOS13Features(*(Model **)((long)ppvVar10 + lVar9));
        lVar9 = lVar9 + 8;
      } while (!bVar11);
    }
    else if (uVar1 == 0xc9) {
      pPVar7 = Specification::Model::pipelineregressor(model);
      pPVar5 = pPVar7->pipeline_;
      if (pPVar5 == (Pipeline *)0x0) {
        pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
      }
      pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
      ppvVar10 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar10 = (void **)0x0;
      }
      iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
      lVar9 = 0;
      do {
        bVar11 = (long)iVar2 * 8 == lVar9;
        bVar4 = !bVar11;
        if (bVar11) {
          return bVar4;
        }
        bVar11 = hasIOS13Features(*(Model **)((long)ppvVar10 + lVar9));
        lVar9 = lVar9 + 8;
      } while (!bVar11);
    }
    else if (((uVar1 != 0x22c) && (uVar1 != 0x194)) && (uVar1 != 0x1f5)) {
      if (uVar1 != 0xca) goto switchD_00207399_caseD_7d1;
      pPVar5 = Specification::Model::pipeline(model);
      pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
      ppvVar10 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar10 = (void **)0x0;
      }
      iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
      lVar9 = 0;
      do {
        bVar11 = (long)iVar2 * 8 == lVar9;
        bVar4 = !bVar11;
        if (bVar11) {
          return bVar4;
        }
        bVar11 = hasIOS13Features(*(Model **)((long)ppvVar10 + lVar9));
        lVar9 = lVar9 + 8;
      } while (!bVar11);
    }
    goto switchD_00207399_caseD_7d3;
  }
  bVar4 = pTVar6->revision_ == 2;
switchD_00207399_caseD_7d3:
  return bVar4;
}

Assistant:

bool CoreML::hasIOS13Features(const Specification::Model& model) {
    // New IOS13 features:
    // - no constraint on rank for NN inputs
    // - model is marked as updatable
    // - model parameters are specified
    // - model is of type kKNearestNeighborsClassifier
    // - model is of sound analysis preprocessing
    // - model is of type LinkedModel
    // - model is of type TextClassifier with revision == 2
    // - model is of type Gazetteer
    // - model is of type WordEmbedding
    // - (... add others here ...)

    if (model.isupdatable()) {
        return true;
    }

    bool result = false;
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result ||hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kKNearestNeighborsClassifier:
        case Specification::Model::kLinkedModel:
            return true;
        case Specification::Model::kItemSimilarityRecommender:
            return hasItemSimilarityRecommender(model);
        case Specification::Model::kSoundAnalysisPreprocessing:
            return hasSoundAnalysisPreprocessing(model);
        case Specification::Model::kTextClassifier:
            return model.textclassifier().revision() == 2;
        case Specification::Model::kGazetteer:
            return model.gazetteer().revision() == 2;
        case Specification::Model::kWordEmbedding:
            return model.wordembedding().revision() == 2;
        default:
            return hasIOS13NeuralNetworkFeatures(model);
    }
    return false;
}